

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value local_30;
  
  Value::Value(&local_30,"All");
  pVVar1 = Value::operator[](settings,"commentStyle");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,"\t");
  pVVar1 = Value::operator[](settings,"indentation");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"enableYAMLCompatibility");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"dropNullPlaceholders");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"useSpecialFloats");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,false);
  pVVar1 = Value::operator[](settings,"emitUTF8");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,0x11);
  pVVar1 = Value::operator[](settings,"precision");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  Value::Value(&local_30,"significant");
  pVVar1 = Value::operator[](settings,"precisionType");
  Value::swap(&local_30,pVVar1);
  Value::~Value(&local_30);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings) {
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  (*settings)["useSpecialFloats"] = false;
  (*settings)["emitUTF8"] = false;
  (*settings)["precision"] = 17;
  (*settings)["precisionType"] = "significant";
  //! [StreamWriterBuilderDefaults]
}